

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O0

reference __thiscall
pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>
          (chunked_sequence<int,_2UL,_4UL,_4UL> *this,int *args)

{
  size_type sVar1;
  size_t sVar2;
  reference pvVar3;
  reference result;
  value_type *tail;
  int *args_local;
  chunked_sequence<int,_2UL,_4UL,_4UL> *this_local;
  
  sVar1 = std::__cxx11::
          list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
          ::size(&this->chunks_);
  if (sVar1 != 0) {
    result = (reference)
             std::__cxx11::
             list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
             ::back(&this->chunks_);
    sVar2 = chunk::size((chunk *)result);
    if (1 < sVar2) {
      std::__cxx11::
      list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
      ::emplace_back<>(&this->chunks_);
      result = (reference)
               std::__cxx11::
               list<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
               ::back(&this->chunks_);
    }
    pvVar3 = chunk::emplace_back<int>((chunk *)result,args);
    this->size_ = this->size_ + 1;
    return pvVar3;
  }
  assert_failed("chunks_.size () > 0U",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/chunked_sequence.hpp"
                ,0x129);
}

Assistant:

auto
    chunked_sequence<T, ElementsPerChunk, ActualSize, ActualAlign>::emplace_back (Args &&... args)
        -> reference {
        PSTORE_ASSERT (chunks_.size () > 0U);
        auto * tail = &chunks_.back ();
        if (PSTORE_UNLIKELY (tail->size () >= ElementsPerChunk)) {
            // Append a new chunk.
            chunks_.emplace_back ();
            tail = &chunks_.back ();
        }
        // Append a new instance to the tail chunk.
        reference result = tail->emplace_back (std::forward<Args> (args)...);
        ++size_;
        return result;
    }